

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append
          (ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *this,SN_ELEMENT *x)

{
  undefined8 *puVar1;
  ON__UINT64 *pOVar2;
  undefined8 uVar3;
  ON__UINT64 OVar4;
  undefined8 uVar5;
  ON__UINT64 OVar6;
  undefined8 uVar7;
  ON__UINT32 OVar8;
  ON__UINT32 OVar9;
  ON__UINT8 OVar10;
  ON__UINT8 OVar11;
  ON__UINT8 OVar12;
  ON__UINT8 OVar13;
  ON__UINT32 OVar14;
  unsigned_short uVar15;
  unsigned_short uVar16;
  uint uVar17;
  SN_ELEMENT *pSVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  
  uVar17 = *(uint *)(this + 0x10);
  pSVar18 = x;
  if (uVar17 == *(uint *)(this + 0x14)) {
    if (((int)uVar17 < 8) || ((ulong)((long)(int)uVar17 * 0x38) < 0x10000001)) {
      uVar21 = 4;
      if (2 < (int)uVar17) {
        uVar21 = uVar17 * 2;
      }
    }
    else {
      uVar21 = 0x49249a;
      if (uVar17 < 0x49249a) {
        uVar21 = uVar17;
      }
      uVar21 = uVar21 + uVar17;
    }
    if (x < *(SN_ELEMENT **)(this + 8) + (int)uVar17 && *(SN_ELEMENT **)(this + 8) <= x) {
      pSVar18 = (SN_ELEMENT *)onmalloc(0x38);
      (pSVar18->m_value).m_u = (x->m_value).m_u;
      uVar17 = (x->m_id).Data1;
      uVar15 = (x->m_id).Data2;
      uVar16 = (x->m_id).Data3;
      uVar3 = *(undefined8 *)(x->m_id).Data4;
      OVar4 = x->m_sn;
      OVar10 = x->m_sn_active;
      OVar11 = x->m_id_active;
      OVar12 = x->m_reserved1;
      OVar13 = x->m_reserved2;
      OVar14 = x->m_id_crc32;
      OVar8 = (x->m_value).m_u_type;
      OVar9 = (x->m_value).m_u32;
      pSVar18->m_next = x->m_next;
      (pSVar18->m_value).m_u_type = OVar8;
      (pSVar18->m_value).m_u32 = OVar9;
      pSVar18->m_sn = OVar4;
      pSVar18->m_sn_active = OVar10;
      pSVar18->m_id_active = OVar11;
      pSVar18->m_reserved1 = OVar12;
      pSVar18->m_reserved2 = OVar13;
      pSVar18->m_id_crc32 = OVar14;
      (pSVar18->m_id).Data1 = uVar17;
      (pSVar18->m_id).Data2 = uVar15;
      (pSVar18->m_id).Data3 = uVar16;
      *(undefined8 *)(pSVar18->m_id).Data4 = uVar3;
      uVar17 = *(uint *)(this + 0x14);
    }
    if (uVar17 < uVar21) {
      SetCapacity(this,(long)(int)uVar21);
    }
    lVar20 = *(long *)(this + 8);
    if (lVar20 == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar17 = *(uint *)(this + 0x10);
  }
  else {
    lVar20 = *(long *)(this + 8);
  }
  *(uint *)(this + 0x10) = uVar17 + 1;
  lVar19 = (long)(int)uVar17 * 0x38;
  *(anon_union_8_5_72d3814f_for_m_u *)(lVar20 + 0x30 + lVar19) = (pSVar18->m_value).m_u;
  uVar3 = *(undefined8 *)&pSVar18->m_id;
  uVar5 = *(undefined8 *)(pSVar18->m_id).Data4;
  OVar4 = pSVar18->m_sn;
  OVar6 = *(ON__UINT64 *)&pSVar18->m_sn_active;
  uVar7 = *(undefined8 *)&pSVar18->m_value;
  puVar1 = (undefined8 *)(lVar20 + 0x20 + lVar19);
  *puVar1 = pSVar18->m_next;
  puVar1[1] = uVar7;
  pOVar2 = (ON__UINT64 *)(lVar20 + 0x10 + lVar19);
  *pOVar2 = OVar4;
  pOVar2[1] = OVar6;
  *(undefined8 *)(lVar20 + lVar19) = uVar3;
  ((undefined8 *)(lVar20 + lVar19))[1] = uVar5;
  if (pSVar18 != x) {
    onfree(pSVar18);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}